

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashids.hpp
# Opt level: O1

string * __thiscall
hashidsxx::Hashids::encode<int_const*>
          (string *__return_storage_ptr__,Hashids *this,int *begin,int *end)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  int values_hash;
  undefined1 local_b8 [8];
  string last;
  undefined1 local_88 [8];
  string alphabet_salt;
  string alphabet;
  
  if (begin == end) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    alphabet_salt.field_2._8_8_ = &alphabet._M_string_length;
    pcVar1 = (this->_alphabet)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&alphabet_salt.field_2 + 8),pcVar1,
               pcVar1 + (this->_alphabet)._M_string_length);
    values_hash = 0;
    iVar3 = 100;
    piVar4 = begin;
    do {
      values_hash = values_hash + *piVar4 % iVar3;
      piVar4 = piVar4 + 1;
      iVar3 = iVar3 + 1;
    } while (piVar4 != end);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    alphabet.field_2._8_8_ = end;
    if (this->_min_length != 0) {
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    if (begin != (int *)alphabet.field_2._8_8_) {
      do {
        iVar3 = *begin;
        local_88 = (undefined1  [8])&alphabet_salt._M_string_length;
        alphabet_salt._M_dataplus._M_p = (pointer)0x0;
        alphabet_salt._M_string_length._0_1_ = 0;
        last.field_2._8_8_ = begin;
        std::__cxx11::string::push_back((char)local_88);
        pcVar2 = (char *)std::__cxx11::string::_M_append
                                   (local_88,(ulong)(this->_salt)._M_dataplus._M_p);
        std::__cxx11::string::_M_append(pcVar2,alphabet_salt.field_2._8_8_);
        _reorder(this,(string *)((long)&alphabet_salt.field_2 + 8),(string *)local_88);
        std::__cxx11::string::_M_assign((string *)(alphabet_salt.field_2._M_local_buf + 8));
        _hash((string *)local_b8,this,(long)iVar3,(string *)((long)&alphabet_salt.field_2 + 8));
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        if (local_b8 != (undefined1  [8])&last._M_string_length) {
          operator_delete((void *)local_b8);
        }
        if (local_88 != (undefined1  [8])&alphabet_salt._M_string_length) {
          operator_delete((void *)local_88);
        }
        begin = (int *)(last.field_2._8_8_ + 4);
      } while (begin != (int *)alphabet.field_2._8_8_);
    }
    std::__cxx11::string::_M_erase
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
    if (__return_storage_ptr__->_M_string_length < (ulong)this->_min_length) {
      _ensure_length(this,__return_storage_ptr__,(string *)((long)&alphabet_salt.field_2 + 8),
                     values_hash);
    }
    if ((size_type *)alphabet_salt.field_2._8_8_ != &alphabet._M_string_length) {
      operator_delete((void *)alphabet_salt.field_2._8_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string encode(const Iterator begin, const Iterator end) const {
    // Encrypting nothing makes no sense
    if (begin == end)
      return "";

    // Make a copy of our alphabet so we can reorder it on the fly etc
    std::string alphabet(_alphabet);

    int values_hash = 0;
    int i = 0;
    for (Iterator iter = begin; iter != end; ++iter) {
      values_hash += (*iter % (i + 100));
      ++i;
    };

    char encoded = _alphabet[values_hash % _alphabet.size()];
    char lottery = encoded;

    std::string output;
    if (_min_length > 0)
      output.reserve(_min_length); // reserve if we have a minimum length
    output.push_back(encoded);

    i = 0;
    for (Iterator iter = begin; iter != end; ++iter) {
      uint64_t number = *iter;

      std::string alphabet_salt;
      alphabet_salt.push_back(lottery);
      alphabet_salt.append(_salt).append(alphabet);

      alphabet = _reorder(alphabet, alphabet_salt);

      std::string last = _hash(number, alphabet);
      output.append(last);

      number %= last[0] + i;
      output.push_back(_separators[number % _separators.size()]);
      ++i;
    };

    // pop_back() is only available with C++11
    output.erase(output.end() - 1);

    if (output.size() < _min_length)
      _ensure_length(output, alphabet, values_hash);

    return output;
  }